

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

bool __thiscall FStateDefinitions::SetGotoLabel(FStateDefinitions *this,char *string)

{
  FState *pFVar1;
  FState *pFVar2;
  
  if (this->laststate == (FState *)0x0) {
    if (this->lastlabel < 0) {
      return false;
    }
    RetargetStatePointers(this->lastlabel + 1,string,&this->StateLabels);
    if (this->laststatebeforelabel == (FState *)0x0) {
      return true;
    }
    pFVar2 = (FState *)copystring(string);
    pFVar1 = this->laststatebeforelabel;
    pFVar1->NextState = pFVar2;
    pFVar1->DefineFlags = '\x04';
  }
  else {
    pFVar2 = (FState *)copystring(string);
    pFVar1 = this->laststate;
    pFVar1->NextState = pFVar2;
    pFVar1->DefineFlags = '\x04';
  }
  this->laststatebeforelabel = (FState *)0x0;
  return true;
}

Assistant:

bool FStateDefinitions::SetGotoLabel(const char *string)
{
	// copy the text - this must be resolved later!
	if (laststate != NULL)
	{ // Following a state definition: Modify it.
		laststate->NextState = (FState*)copystring(string);	
		laststate->DefineFlags = SDF_LABEL;
		laststatebeforelabel = NULL;
		return true;
	}
	else if (lastlabel >= 0)
	{ // Following a label: Retarget it.
		RetargetStates (lastlabel+1, string);
		if (laststatebeforelabel != NULL)
		{
			laststatebeforelabel->NextState = (FState*)copystring(string);	
			laststatebeforelabel->DefineFlags = SDF_LABEL;
			laststatebeforelabel = NULL;
		}
		return true;
	}
	return false;
}